

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

Gia_Man_t * Gia_ManFormulaUnfold(Gia_Man_t *p,char *pForm,int fFfOnly)

{
  int iVar1;
  char *__s;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Gia_Man_t *p_00;
  char *__dest;
  Vec_Int_t *pVVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  Gia_Man_t *pGVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  Gia_Obj_t *pGVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int nPars;
  int iFans [2];
  int nVars;
  int iCtrl [8];
  char pStr [100];
  uint local_d8;
  int local_d4;
  uint local_d0;
  uint local_cc;
  Gia_Obj_t *local_c8;
  int local_bc;
  int local_b8 [8];
  char local_98 [104];
  
  local_d4 = fFfOnly;
  sVar4 = strlen(pForm);
  if (99 < sVar4) {
    __assert_fail("strlen(pForm) < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrCount(pForm,&local_bc,(int *)&local_d8);
  if (local_bc != 2) {
    __assert_fail("nVars == 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x34f,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  Gia_FormStrTransform(local_98,pForm);
  Gia_ManPrintFormula(local_98);
  p_00 = Gia_ManStart(p->nObjs * 5);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar4 = strlen(__s);
    __dest = (char *)malloc(sVar4 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar15];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0059694c;
      pGVar12 = p->pObjs;
      if (pGVar12 == (Gia_Obj_t *)0x0) break;
      pGVar6 = Gia_ManAppendObj(p_00);
      uVar16 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar16 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar16 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) {
LAB_0059692d:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar6)) goto LAB_0059692d;
      pGVar12[iVar9].Value = (int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
      pVVar5 = p->vCis;
    } while (lVar15 < pVVar5->nSize);
  }
  uVar14 = local_d8;
  if (local_d4 == 0) {
    iVar9 = p->nObjs;
    if (iVar9 < 1) {
      iVar2 = 0;
    }
    else {
      uVar16 = (ulong)local_d8;
      lVar15 = 0;
      do {
        iVar2 = 0;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar12 = p->pObjs + lVar15;
        uVar11 = *(ulong *)pGVar12;
        uVar10 = uVar11 & 0x1fffffff;
        if (uVar10 != 0x1fffffff && -1 < (int)uVar11) {
          if (0 < (int)uVar14) {
            uVar11 = 0;
            local_c8 = pGVar12;
            do {
              pGVar7 = Gia_ManAppendObj(p_00);
              uVar10 = *(ulong *)pGVar7;
              *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
              *(ulong *)pGVar7 =
                   uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                   (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
              pGVar12 = p_00->pObjs;
              if ((pGVar7 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar7)) goto LAB_0059692d;
              Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar12) >> 2) * -0x55555555
                         );
              pGVar12 = p_00->pObjs;
              if ((pGVar7 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar7)) goto LAB_0059692d;
              local_b8[uVar11] = (int)((ulong)((long)pGVar7 - (long)pGVar12) >> 2) * 0x55555556;
              uVar11 = uVar11 + 1;
            } while (uVar16 != uVar11);
            uVar11 = *(ulong *)local_c8;
            uVar10 = (ulong)((uint)uVar11 & 0x1fffffff);
            pGVar12 = local_c8;
          }
          if ((int)pGVar12[-uVar10].Value < 0) goto LAB_0059696b;
          local_d0 = (uint)(uVar11 >> 0x1d) & 1 ^ pGVar12[-uVar10].Value;
          uVar13 = (uint)(*(ulong *)pGVar12 >> 0x20);
          if ((int)pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value < 0) goto LAB_0059696b;
          local_cc = uVar13 >> 0x1d & 1 ^ pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value;
          sVar4 = strlen(local_98);
          uVar13 = Gia_ManRealizeFormula_rec
                             (p_00,(int *)&local_d0,local_b8,local_98,local_98 + sVar4,uVar14);
          pGVar12->Value = uVar13;
          iVar9 = p->nObjs;
        }
        iVar2 = 0;
        lVar15 = lVar15 + 1;
      } while (lVar15 < iVar9);
    }
  }
  else {
    Gia_ManCleanMark0(p);
    uVar14 = local_d8;
    iVar9 = p->nRegs;
    if (0 < iVar9) {
      iVar2 = 0;
      do {
        iVar3 = p->vCos->nSize;
        uVar13 = (iVar3 - iVar9) + iVar2;
        if (((int)uVar13 < 0) || (iVar3 <= (int)uVar13)) goto LAB_0059698a;
        iVar9 = p->vCos->pArray[uVar13];
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0059694c;
        if (p->pObjs == (Gia_Obj_t *)0x0) goto LAB_005963c1;
        pGVar12 = p->pObjs + iVar9;
        *(ulong *)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)) =
             *(ulong *)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)) | 0x40000000;
        iVar2 = iVar2 + 1;
        iVar9 = p->nRegs;
      } while (iVar2 < iVar9);
    }
    if (p->nObjs < 1) {
      iVar2 = 0;
    }
    else {
LAB_005963c1:
      uVar16 = (ulong)local_d8;
      lVar15 = 0;
      iVar2 = 0;
      do {
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar12 = p->pObjs + lVar15;
        uVar11 = *(ulong *)pGVar12;
        uVar10 = uVar11 & 0x1fffffff;
        if (uVar10 != 0x1fffffff && -1 < (int)(uint)uVar11) {
          if (((uint)uVar11 >> 0x1e & 1) == 0) {
            if ((int)pGVar12[-uVar10].Value < 0) goto LAB_0059696b;
            uVar13 = (uint)(uVar11 >> 0x20);
            if ((int)pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value < 0) goto LAB_0059696b;
            uVar13 = Gia_ManHashAnd(p_00,pGVar12[-uVar10].Value ^ (uint)(uVar11 >> 0x1d) & 7,
                                    pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value ^
                                    uVar13 >> 0x1d & 1);
            pGVar12->Value = uVar13;
          }
          else {
            if (0 < (int)uVar14) {
              uVar11 = 0;
              local_c8 = pGVar12;
              do {
                pGVar7 = Gia_ManAppendObj(p_00);
                uVar10 = *(ulong *)pGVar7;
                *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
                *(ulong *)pGVar7 =
                     uVar10 & 0xe0000000ffffffff | 0x9fffffff |
                     (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
                pGVar12 = p_00->pObjs;
                if ((pGVar7 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar7)) goto LAB_0059692d;
                Vec_IntPush(p_00->vCis,
                            (int)((ulong)((long)pGVar7 - (long)pGVar12) >> 2) * -0x55555555);
                pGVar12 = p_00->pObjs;
                if ((pGVar7 < pGVar12) || (pGVar12 + p_00->nObjs <= pGVar7)) goto LAB_0059692d;
                local_b8[uVar11] = (int)((ulong)((long)pGVar7 - (long)pGVar12) >> 2) * 0x55555556;
                uVar11 = uVar11 + 1;
              } while (uVar16 != uVar11);
              uVar11 = *(ulong *)local_c8;
              uVar10 = (ulong)((uint)uVar11 & 0x1fffffff);
              pGVar12 = local_c8;
            }
            if ((int)pGVar12[-uVar10].Value < 0) goto LAB_0059696b;
            local_d0 = (uint)(uVar11 >> 0x1d) & 1 ^ pGVar12[-uVar10].Value;
            uVar13 = (uint)(*(ulong *)pGVar12 >> 0x20);
            if ((int)pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value < 0) goto LAB_0059696b;
            local_cc = uVar13 >> 0x1d & 1 ^ pGVar12[-(ulong)(uVar13 & 0x1fffffff)].Value;
            sVar4 = strlen(local_98);
            uVar13 = Gia_ManRealizeFormula_rec
                               (p_00,(int *)&local_d0,local_b8,local_98,local_98 + sVar4,uVar14);
            pGVar12->Value = uVar13;
            iVar2 = iVar2 + 1;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 < p->nObjs);
      iVar9 = p->nRegs;
    }
    if (0 < iVar9) {
      iVar3 = 0;
      do {
        iVar1 = p->vCos->nSize;
        uVar14 = (iVar1 - iVar9) + iVar3;
        if (((int)uVar14 < 0) || (iVar1 <= (int)uVar14)) {
LAB_0059698a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar9 = p->vCos->pArray[uVar14];
        if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0059694c;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar12 = p->pObjs + iVar9;
        *(ulong *)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)) =
             *(ulong *)(pGVar12 + -(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)) &
             0xffffffffbfffffff;
        iVar3 = iVar3 + 1;
        iVar9 = p->nRegs;
      } while (iVar3 < iVar9);
    }
  }
  pVVar5 = p->vCos;
  if (0 < pVVar5->nSize) {
    lVar15 = 0;
    do {
      iVar9 = pVVar5->pArray[lVar15];
      if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) {
LAB_0059694c:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar12 = p->pObjs + iVar9;
      if ((int)pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].Value < 0) {
LAB_0059696b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar14 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar12 >> 0x1d & 1 ^
                                    pGVar12[-(ulong)((uint)*(undefined8 *)pGVar12 & 0x1fffffff)].
                                    Value);
      pGVar12->Value = uVar14;
      lVar15 = lVar15 + 1;
      pVVar5 = p->vCos;
    } while (lVar15 < pVVar5->nSize);
  }
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  iVar9 = p->vCis->nSize;
  if (local_d4 == 0) {
    iVar2 = ~(p->vCos->nSize + iVar9) + p->nObjs;
  }
  if (pGVar8->vCis->nSize - pGVar8->nRegs != iVar2 * local_d8 + iVar9) {
    __assert_fail("Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x37d,"Gia_Man_t *Gia_ManFormulaUnfold(Gia_Man_t *, char *, int)");
  }
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManFormulaUnfold( Gia_Man_t * p, char * pForm, int fFfOnly )
{
    char pStr[100];
    int Count = 0;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, k, iCtrl[FFTEST_MAX_PARS], iFans[FFTEST_MAX_VARS];
    int nVars, nPars;
    assert( strlen(pForm) < 100 );
    Gia_FormStrCount( pForm, &nVars, &nPars );
    assert( nVars == 2 );
    Gia_FormStrTransform( pStr, pForm );
    Gia_ManPrintFormula( pStr );
    pNew = Gia_ManStart( 5 * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    if ( fFfOnly )
    {
        Gia_ManCleanMark0( p );
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( pObj->fMark0 )
            {
                for ( k = 0; k < nPars; k++ )
                    iCtrl[k] = Gia_ManAppendCi(pNew);
                iFans[0] = Gia_ObjFanin0Copy(pObj);
                iFans[1] = Gia_ObjFanin1Copy(pObj);
                pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
                Count++;
            }
            else
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ObjFanin0(pObj)->fMark0 = 0;
    }
    else
    {
        Gia_ManForEachAnd( p, pObj, i )
        {
            for ( k = 0; k < nPars; k++ )
                iCtrl[k] = Gia_ManAppendCi(pNew);
            iFans[0] = Gia_ObjFanin0Copy(pObj);
            iFans[1] = Gia_ObjFanin1Copy(pObj);
            pObj->Value = Gia_ManRealizeFormula( pNew, iFans, iCtrl, pStr, nPars );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == Gia_ManCiNum(p) + nPars * (fFfOnly ? Count : Gia_ManAndNum(p)) );
//    if ( fUseFaults )
//        Gia_AigerWrite( pNew, "newfault.aig", 0, 0, 0 );
    return pNew;
}